

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_UShort * ft_var_readpackedpoints(FT_Stream stream,FT_ULong size,FT_UInt *point_cnt)

{
  FT_Memory memory;
  byte bVar1;
  byte bVar2;
  FT_UShort FVar3;
  uint uVar4;
  uint uVar5;
  FT_UShort *pFVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  FT_UShort FVar11;
  bool bVar12;
  FT_Error local_4c;
  FT_UShort *local_48;
  FT_Stream local_40;
  uint local_34;
  
  memory = stream->memory;
  local_4c = 0;
  *point_cnt = 0;
  bVar1 = FT_Stream_GetChar(stream);
  if (bVar1 == 0) {
    local_48 = (FT_UShort *)0xffffffffffffffff;
  }
  else {
    uVar9 = (ulong)bVar1;
    if ((char)bVar1 < '\0') {
      bVar2 = FT_Stream_GetChar(stream);
      uVar9 = (ulong)((uint)bVar2 | (bVar1 & 0x7f) << 8);
    }
    uVar7 = (uint)uVar9;
    if (size < uVar9) {
      local_48 = (FT_UShort *)0x0;
    }
    else {
      pFVar6 = (FT_UShort *)ft_mem_realloc(memory,2,0,(ulong)(uVar7 + 1),(void *)0x0,&local_4c);
      local_48 = (FT_UShort *)0x0;
      if ((local_4c == 0) && (*point_cnt = uVar7, local_48 = pFVar6, uVar7 != 0)) {
        FVar11 = 0;
        uVar4 = 0;
        local_40 = stream;
        do {
          bVar1 = FT_Stream_GetChar(stream);
          local_34 = uVar4 + 1;
          uVar8 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            FVar3 = FT_Stream_GetUShort(stream);
            FVar11 = FVar11 + FVar3;
            local_48[uVar4] = FVar11;
            uVar10 = local_34;
            if ((bVar1 & 0x7f) != 0) {
              uVar10 = 1;
              do {
                FVar3 = FT_Stream_GetUShort(local_40);
                FVar11 = FVar11 + FVar3;
                local_48[uVar4 + uVar10] = FVar11;
                uVar5 = uVar10 + 1;
                if (uVar7 <= uVar4 + uVar10 + 1) break;
                bVar12 = uVar10 < (uVar8 & 0x7f);
                uVar10 = uVar5;
              } while (bVar12);
              goto LAB_00228da3;
            }
          }
          else {
            bVar1 = FT_Stream_GetChar(stream);
            FVar11 = FVar11 + bVar1;
            local_48[uVar4] = FVar11;
            uVar10 = local_34;
            if (uVar8 != 0) {
              uVar10 = 1;
              do {
                bVar1 = FT_Stream_GetChar(local_40);
                FVar11 = FVar11 + bVar1;
                local_48[uVar4 + uVar10] = FVar11;
                uVar5 = uVar10 + 1;
                if (uVar7 <= uVar4 + uVar10 + 1) break;
                bVar12 = uVar10 < uVar8;
                uVar10 = uVar5;
              } while (bVar12);
LAB_00228da3:
              stream = local_40;
              uVar10 = uVar4 + uVar5;
            }
          }
          uVar4 = uVar10;
        } while (uVar4 < uVar7);
      }
    }
  }
  return local_48;
}

Assistant:

static FT_UShort*
  ft_var_readpackedpoints( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt   *point_cnt )
  {
    FT_UShort *points = NULL;
    FT_UInt    n;
    FT_UInt    runcnt;
    FT_UInt    i, j;
    FT_UShort  first;
    FT_Memory  memory = stream->memory;
    FT_Error   error  = FT_Err_Ok;

    FT_UNUSED( error );


    *point_cnt = 0;

    n = FT_GET_BYTE();
    if ( n == 0 )
      return ALL_POINTS;

    if ( n & GX_PT_POINTS_ARE_WORDS )
    {
      n  &= GX_PT_POINT_RUN_COUNT_MASK;
      n <<= 8;
      n  |= FT_GET_BYTE();
    }

    if ( n > size )
    {
      FT_TRACE1(( "ft_var_readpackedpoints: number of points too large\n" ));
      return NULL;
    }

    /* in the nested loops below we increase `i' twice; */
    /* it is faster to simply allocate one more slot    */
    /* than to add another test within the loop         */
    if ( FT_NEW_ARRAY( points, n + 1 ) )
      return NULL;

    *point_cnt = n;

    first = 0;
    i     = 0;
    while ( i < n )
    {
      runcnt = FT_GET_BYTE();
      if ( runcnt & GX_PT_POINTS_ARE_WORDS )
      {
        runcnt     &= GX_PT_POINT_RUN_COUNT_MASK;
        first      += FT_GET_USHORT();
        points[i++] = first;

        /* first point not included in run count */
        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_USHORT();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
      else
      {
        first      += FT_GET_BYTE();
        points[i++] = first;

        for ( j = 0; j < runcnt; j++ )
        {
          first      += FT_GET_BYTE();
          points[i++] = first;
          if ( i >= n )
            break;
        }
      }
    }

    return points;
  }